

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::UninterpretedOption::UninterpretedOption
          (UninterpretedOption *this,UninterpretedOption *from)

{
  void *pvVar1;
  int64 iVar2;
  uint uVar3;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__UninterpretedOption_00772c90;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::RepeatedPtrField
            (&this->name_,&from->name_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->identifier_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (from->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->identifier_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->identifier_value_).ptr_);
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  (this->string_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar3 & 2) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->string_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->string_value_).ptr_);
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  (this->aggregate_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar3 & 4) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->aggregate_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->aggregate_value_).ptr_);
  }
  this->double_value_ = from->double_value_;
  iVar2 = from->negative_int_value_;
  this->positive_int_value_ = from->positive_int_value_;
  this->negative_int_value_ = iVar2;
  return;
}

Assistant:

UninterpretedOption::UninterpretedOption(const UninterpretedOption& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      name_(from.name_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  identifier_value_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_identifier_value()) {
    identifier_value_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.identifier_value_);
  }
  string_value_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_string_value()) {
    string_value_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.string_value_);
  }
  aggregate_value_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_aggregate_value()) {
    aggregate_value_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.aggregate_value_);
  }
  ::memcpy(&positive_int_value_, &from.positive_int_value_,
    reinterpret_cast<char*>(&double_value_) -
    reinterpret_cast<char*>(&positive_int_value_) + sizeof(double_value_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.UninterpretedOption)
}